

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

string * __thiscall
skiwi::skiwi_raw_to_string_abi_cxx11_
          (string *__return_storage_ptr__,skiwi *this,uint64_t scm_value,streamsize precision)

{
  stringstream ss;
  __shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2> _Stack_1b8;
  stringstream local_1a8 [16];
  long local_198;
  long local_190 [46];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(long *)((long)local_190 + *(long *)(local_198 + -0x18)) = (long)(int)scm_value;
  std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&_Stack_1b8,
               (__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                *)&DAT_002b3910);
  scheme_runtime((uint64_t)this,(ostream *)&local_198,
                 (shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&_Stack_1b8,
                 (repl_data *)&DAT_002b3878,(context *)&DAT_002b3720);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1b8._M_refcount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string skiwi_raw_to_string(uint64_t scm_value, std::streamsize precision)
  {
  std::stringstream ss;
  ss << std::setprecision(precision);
  scheme_runtime(scm_value, ss, cd.env, cd.rd, &cd.ctxt);
  return ss.str();
  }